

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# client.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  int iVar1;
  int thread_num;
  int block_size;
  int session_count;
  int timeout;
  ostream *poVar2;
  CppNet *this;
  read_call_back local_148;
  _Bind<void_(Client::*(Client_*,_std::_Placeholder<1>,_std::_Placeholder<2>,_std::_Placeholder<3>))(std::shared_ptr<cppnet::CNSocket>,_std::shared_ptr<cppnet::Buffer>,_unsigned_int)>
  local_128;
  string ip;
  Client client;
  
  if (argc < 7) {
    poVar2 = std::operator<<((ostream *)&std::cout,
                             "please input [ip] [port] [thread count] [block size] [session count] [time out]"
                            );
    std::endl<char,std::char_traits<char>>(poVar2);
    iVar1 = -1;
  }
  else {
    std::__cxx11::string::string((string *)&ip,argv[1],(allocator *)&client);
    iVar1 = atoi(argv[2]);
    thread_num = atoi(argv[3]);
    block_size = atoi(argv[4]);
    session_count = atoi(argv[5]);
    timeout = atoi(argv[6]);
    this = (CppNet *)operator_new(0x10);
    (this->_cppnet_base).super___shared_ptr<cppnet::CppNetBase,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    (this->_cppnet_base).super___shared_ptr<cppnet::CppNetBase,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    cppnet::CppNet::Init(this,thread_num);
    Client::Client(&client,block_size,session_count,timeout,&ip,iVar1,this);
    local_128._M_f = (offset_in_Client_to_subr)Client::OnConnect;
    local_128._8_8_ = 0;
    local_128._M_bound_args.
    super__Tuple_impl<0UL,_Client_*,_std::_Placeholder<1>,_std::_Placeholder<2>,_std::_Placeholder<3>_>
    .super__Head_base<0UL,_Client_*,_false>._M_head_impl =
         (_Tuple_impl<0UL,_Client_*,_std::_Placeholder<1>,_std::_Placeholder<2>,_std::_Placeholder<3>_>
          )(_Tuple_impl<0UL,_Client_*,_std::_Placeholder<1>,_std::_Placeholder<2>,_std::_Placeholder<3>_>
            )&client;
    std::function<void(std::shared_ptr<cppnet::CNSocket>,unsigned_int)>::
    function<std::_Bind<void(Client::*(Client*,std::_Placeholder<1>,std::_Placeholder<2>))(std::shared_ptr<cppnet::CNSocket>,unsigned_int)>,void>
              ((function<void(std::shared_ptr<cppnet::CNSocket>,unsigned_int)> *)&local_148,
               (_Bind<void_(Client::*(Client_*,_std::_Placeholder<1>,_std::_Placeholder<2>))(std::shared_ptr<cppnet::CNSocket>,_unsigned_int)>
                *)&local_128);
    cppnet::CppNet::SetConnectionCallback(this,(connect_call_back *)&local_148);
    std::_Function_base::~_Function_base(&local_148.super__Function_base);
    local_128._M_f = (offset_in_Client_to_subr)Client::OnMessage;
    local_128._8_8_ = 0;
    local_128._M_bound_args.
    super__Tuple_impl<0UL,_Client_*,_std::_Placeholder<1>,_std::_Placeholder<2>,_std::_Placeholder<3>_>
    .super__Head_base<0UL,_Client_*,_false>._M_head_impl =
         (_Tuple_impl<0UL,_Client_*,_std::_Placeholder<1>,_std::_Placeholder<2>,_std::_Placeholder<3>_>
          )(_Tuple_impl<0UL,_Client_*,_std::_Placeholder<1>,_std::_Placeholder<2>,_std::_Placeholder<3>_>
            )&client;
    std::
    function<void(std::shared_ptr<cppnet::CNSocket>,std::shared_ptr<cppnet::Buffer>,unsigned_int)>::
    function<std::_Bind<void(Client::*(Client*,std::_Placeholder<1>,std::_Placeholder<2>,std::_Placeholder<3>))(std::shared_ptr<cppnet::CNSocket>,std::shared_ptr<cppnet::Buffer>,unsigned_int)>,void>
              ((function<void(std::shared_ptr<cppnet::CNSocket>,std::shared_ptr<cppnet::Buffer>,unsigned_int)>
                *)&local_148,&local_128);
    cppnet::CppNet::SetReadCallback(this,&local_148);
    std::_Function_base::~_Function_base(&local_148.super__Function_base);
    local_128._M_f = (offset_in_Client_to_subr)Client::OnDisconnect;
    local_128._8_8_ = 0;
    local_128._M_bound_args.
    super__Tuple_impl<0UL,_Client_*,_std::_Placeholder<1>,_std::_Placeholder<2>,_std::_Placeholder<3>_>
    .super__Head_base<0UL,_Client_*,_false>._M_head_impl =
         (_Tuple_impl<0UL,_Client_*,_std::_Placeholder<1>,_std::_Placeholder<2>,_std::_Placeholder<3>_>
          )(_Tuple_impl<0UL,_Client_*,_std::_Placeholder<1>,_std::_Placeholder<2>,_std::_Placeholder<3>_>
            )&client;
    std::function<void(std::shared_ptr<cppnet::CNSocket>,unsigned_int)>::
    function<std::_Bind<void(Client::*(Client*,std::_Placeholder<1>,std::_Placeholder<2>))(std::shared_ptr<cppnet::CNSocket>,unsigned_int)>,void>
              ((function<void(std::shared_ptr<cppnet::CNSocket>,unsigned_int)> *)&local_148,
               (_Bind<void_(Client::*(Client_*,_std::_Placeholder<1>,_std::_Placeholder<2>))(std::shared_ptr<cppnet::CNSocket>,_unsigned_int)>
                *)&local_128);
    cppnet::CppNet::SetDisconnectionCallback(this,(connect_call_back *)&local_148);
    std::_Function_base::~_Function_base(&local_148.super__Function_base);
    Client::Start(&client);
    cppnet::CppNet::Join(this);
    cppnet::CppNet::~CppNet(this);
    operator_delete(this);
    Client::~Client(&client);
    std::__cxx11::string::~string((string *)&ip);
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int main(int argc, char* argv[]) {

    if (argc < 7) {
       std::cout << "please input [ip] [port] [thread count] [block size] [session count] [time out]" << std::endl;
       return -1;
    }
    
    std::string ip    = std::string(argv[1]);
    int port          = atoi(argv[2]);
    int threadCount   = atoi(argv[3]);
    int block_size    = atoi(argv[4]);
    int session_count = atoi(argv[5]);
    int timeout       = atoi(argv[6]);

    cppnet::CppNet* net = new cppnet::CppNet;
    net->Init(threadCount);

    Client client(block_size, session_count, timeout, ip, port, net);

    net->SetConnectionCallback(std::bind(&Client::OnConnect, &client, std::placeholders::_1, std::placeholders::_2));
    net->SetReadCallback(std::bind(&Client::OnMessage, &client, std::placeholders::_1, std::placeholders::_2,
                                   std::placeholders::_3));
    net->SetDisconnectionCallback(std::bind(&Client::OnDisconnect, &client, std::placeholders::_1, std::placeholders::_2));

    client.Start();

    net->Join();

    delete net;

    return 0;
}